

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O0

void test_linear_hash_increment_buckets(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  int local_28;
  int local_24;
  int i;
  int original_number_buckets;
  double split_cardinality;
  linear_hash_table_t *linear_hash;
  planck_unit_test_t *tc_local;
  
  linear_hash = (linear_hash_table_t *)tc;
  split_cardinality = (double)malloc(0x78);
  test_linear_hash_setup((planck_unit_test_t *)linear_hash,(linear_hash_table_t *)split_cardinality)
  ;
  _i = (double)((*(int *)((long)split_cardinality + 0x38) * *(int *)((long)split_cardinality + 0x30)
                * *(int *)((long)split_cardinality + 0x2c)) / 100);
  local_24 = *(int *)((long)split_cardinality + 0x30);
  local_28 = 0;
  while( true ) {
    if (_i <= (double)local_28) {
      local_34 = 0x11;
      local_38 = 0x13;
      test_linear_hash_insert
                ((planck_unit_test_t *)linear_hash,&local_34,&local_38,'\0',1,'\x01',
                 (linear_hash_table_t *)split_cardinality);
      pVar1 = planck_unit_assert_true
                        ((planck_unit_test_t *)linear_hash,
                         (uint)(local_24 + 1 == *(int *)((long)split_cardinality + 0x30)),0x123,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      test_linear_hash_takedown
                ((planck_unit_test_t *)linear_hash,(linear_hash_table_t *)split_cardinality);
      return;
    }
    local_2c = 0x11;
    local_30 = 0x13;
    test_linear_hash_insert
              ((planck_unit_test_t *)linear_hash,&local_2c,&local_30,'\0',1,'\x01',
               (linear_hash_table_t *)split_cardinality);
    pVar1 = planck_unit_assert_true
                      ((planck_unit_test_t *)linear_hash,
                       (uint)(local_24 == *(int *)((long)split_cardinality + 0x30)),0x11e,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    local_28 = local_28 + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_increment_buckets(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	double split_cardinality	= linear_hash->records_per_bucket * linear_hash->num_buckets * linear_hash->split_threshold / 100;

	int original_number_buckets = linear_hash->num_buckets;
	int i;

	/* test while inserting to reach threshold - linear_hash.num_buckets should not change over this range */
	for (i = 0; i < split_cardinality; i++) {
		test_linear_hash_insert(tc, IONIZE(17, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
		PLANCK_UNIT_ASSERT_TRUE(tc, original_number_buckets == linear_hash->num_buckets);
	}

	/* test inserting push above threshold - linear_hash.num_buckets should increase by one */
	test_linear_hash_insert(tc, IONIZE(17, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
	PLANCK_UNIT_ASSERT_TRUE(tc, original_number_buckets + 1 == linear_hash->num_buckets);

	test_linear_hash_takedown(tc, linear_hash);
}